

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

bool __thiscall crsGA::Logger::addLogHandler(Logger *this,LogHandlerPtr *logHandler,string *id)

{
  __shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::mutex::lock(&this->_mutex);
  this_00 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
             ::operator[](&this->_logHandlersMap,id)->
             super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&logHandler->super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return true;
}

Assistant:

bool Logger::addLogHandler(Logger::LogHandlerPtr logHandler, const std::string &id)
{
    std::lock_guard<std::mutex> lock(_mutex);

    _logHandlersMap[id] = logHandler;
    return true;
}